

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::utils::CommandLineArgs::setArgs(CommandLineArgs *this,int argc,char **argv)

{
  char *__s;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  long lVar6;
  string key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  long local_58;
  size_type local_50 [2];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_38;
  
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_params;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40,
                    (this->m_params).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&this->m_paramsWithValue;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_38);
  if (argv != (char **)0x0 && argc != 0) {
    this->m_argc = argc;
    this->m_argv = argv;
    if (1 < argc) {
      lVar6 = 1;
      do {
        __s = this->m_argv[lVar6];
        pcVar2 = strchr(__s,0x3d);
        if (pcVar2 == (char *)0x0) {
          bVar1 = hasParam(this,__s);
          if (!bVar1) {
            ::std::__cxx11::string::string
                      ((string *)&local_a0,this->m_argv[lVar6],(allocator *)&local_60);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_40,&local_a0.first);
            uVar4 = local_a0.first.field_2._M_allocated_capacity;
            _Var5._M_p = local_a0.first._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) goto LAB_0015abee;
          }
        }
        else if (*pcVar2 != '\0') {
          ::std::__cxx11::string::string((string *)&local_60,__s,(allocator *)&local_a0);
          ::std::__cxx11::string::find((char)(string *)&local_60,0x3d);
          ::std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_60);
          ::std::__cxx11::string::operator=((string *)&local_60,(string *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
            operator_delete(local_a0.first._M_dataplus._M_p,
                            local_a0.first.field_2._M_allocated_capacity + 1);
          }
          bVar1 = hasParamWithValue(this,local_60->_M_local_buf);
          if (!bVar1) {
            local_c0 = &local_b0;
            sVar3 = strlen(pcVar2 + 1);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,pcVar2 + 1,pcVar2 + sVar3 + 1);
            local_a0.first._M_dataplus._M_p = (pointer)&local_a0.first.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,local_60,local_60->_M_local_buf + local_58);
            local_a0.second._M_dataplus._M_p = (pointer)&local_a0.second.field_2;
            if (local_c0 == &local_b0) {
              local_a0.second.field_2._8_8_ = local_b0._8_8_;
            }
            else {
              local_a0.second._M_dataplus._M_p = (pointer)local_c0;
            }
            local_a0.second.field_2._M_allocated_capacity._1_7_ =
                 local_b0._M_allocated_capacity._1_7_;
            local_a0.second.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
            local_a0.second._M_string_length = local_b8;
            local_b8 = 0;
            local_b0._M_local_buf[0] = '\0';
            local_c0 = &local_b0;
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      (local_38,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.second._M_dataplus._M_p != &local_a0.second.field_2) {
              operator_delete(local_a0.second._M_dataplus._M_p,
                              local_a0.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
              operator_delete(local_a0.first._M_dataplus._M_p,
                              local_a0.first.field_2._M_allocated_capacity + 1);
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,
                                                local_b0._M_local_buf[0]) + 1);
            }
          }
          uVar4 = local_50[0];
          _Var5._M_p = (pointer)local_60;
          if (local_60 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50) {
LAB_0015abee:
            operator_delete(_Var5._M_p,uVar4 + 1);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->m_argc);
    }
  }
  return;
}

Assistant:

void CommandLineArgs::setArgs(int argc, char** argv) {
  m_params.clear();
  m_paramsWithValue.clear();
  if (argc == 0 || argv == nullptr) {
    return;
  }
  m_argc = argc;
  m_argv = argv;
  for (int i = 1; i < m_argc; ++i) {
    const char* v = (strstr(m_argv[i], "="));
    if (v != nullptr && strlen(v) > 0) {
      std::string key = std::string(m_argv[i]);
      key = key.substr(0, key.find_first_of('='));
      if (hasParamWithValue(key.c_str())) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << key << "] arg since it already has value ["
                           << getParamValue(key.c_str()) << "]");
      } else {
        m_paramsWithValue.insert(std::make_pair(key, std::string(v + 1)));
      }
    }
    if (v == nullptr) {
      if (hasParam(m_argv[i])) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << m_argv[i] << "] arg since it already exists");
      } else {
        m_params.push_back(std::string(m_argv[i]));
      }
    }
  }
}